

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryf
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  undefined1 *puVar1;
  invalid_argument *this;
  Index __val;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_110;
  Matrix<double,__1,_1,_0,__1,_1> local_100;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_f0;
  MatrixXd *L;
  string local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  double local_30;
  double xmax_local;
  double xmin_local;
  VectorXd *f_local;
  size_t N_local;
  
  local_30 = xmax;
  xmax_local = xmin;
  xmin_local = (double)f;
  f_local = (VectorXd *)N;
  N_local = (size_t)__return_storage_ptr__;
  puVar1 = (undefined1 *)
           Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)f);
  if (puVar1 != (undefined1 *)
                ((long)&(f_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 1)) {
    L._7_1_ = 1;
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    __val = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
    std::__cxx11::to_string(&local_b0,__val);
    std::operator+(&local_90,"Size of f [",&local_b0);
    std::operator+(&local_70,&local_90,"] does not equal N+1 with N of ");
    std::__cxx11::to_string(&local_e0,(unsigned_long)f_local);
    std::operator+(&local_50,&local_70,&local_e0);
    std::invalid_argument::invalid_argument(this,(string *)&local_50);
    L._7_1_ = 0;
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_f0 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,(size_t)f_local);
  local_110 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        (local_f0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local)
  ;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_100,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_110);
  ChebyshevExpansion(__return_storage_ptr__,(vectype *)&local_100,xmax_local,local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_100);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryf(const std::size_t N, const Eigen::VectorXd &f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        // Step 3: Get coefficients for the L matrix from the library of coefficients
        const Eigen::MatrixXd &L = l_matrix_library.get(N);
        // Step 4: Obtain coefficients from vector - matrix product
        return ChebyshevExpansion(L*f, xmin, xmax);
    }